

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int capture_ptr(frozen *f,char *ptr,json_type type)

{
  int iVar1;
  json_token *pjVar2;
  int iVar3;
  
  if ((f->do_realloc != 0) && (iVar1 = f->max_tokens, iVar1 <= f->num_tokens)) {
    iVar3 = 100;
    if (iVar1 != 0) {
      iVar3 = iVar1 * 2;
    }
    pjVar2 = (json_token *)realloc(f->tokens,(long)iVar3 * 0x18);
    if (pjVar2 == (json_token *)0x0) {
      return -3;
    }
    f->max_tokens = iVar3;
    f->tokens = pjVar2;
  }
  pjVar2 = f->tokens;
  iVar1 = 0;
  if ((pjVar2 != (json_token *)0x0) && (iVar1 = 0, f->max_tokens != 0)) {
    iVar3 = f->num_tokens;
    iVar1 = -3;
    if (iVar3 < f->max_tokens) {
      pjVar2[iVar3].ptr = ptr;
      pjVar2[iVar3].type = type;
      f->num_tokens = iVar3 + 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int capture_ptr(struct frozen *f, const char *ptr, enum json_type type) {
    if (f->do_realloc && f->num_tokens >= f->max_tokens) {
        int new_size = f->max_tokens == 0 ? 100 : f->max_tokens * 2;
        void *p = FROZEN_REALLOC(f->tokens, new_size * sizeof(f->tokens[0]));
        if (p == NULL) return JSON_TOKEN_ARRAY_TOO_SMALL;
        f->max_tokens = new_size;
        f->tokens = (struct json_token *) p;
    }
    if (f->tokens == NULL || f->max_tokens == 0) return 0;
    if (f->num_tokens >= f->max_tokens) return JSON_TOKEN_ARRAY_TOO_SMALL;
    f->tokens[f->num_tokens].ptr = ptr;
    f->tokens[f->num_tokens].type = type;
    f->num_tokens++;
    return 0;
}